

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O3

void Nwk_ManMarkFanouts_rec(Nwk_Obj_t *pLut,int nLevMax,int nFanMax)

{
  int iVar1;
  long lVar2;
  
  if (((((*(uint *)&pLut->field_0x20 & 7) == 3) &&
       (iVar1 = pLut->pMan->nTravIds, pLut->TravId != iVar1)) &&
      (pLut->TravId = iVar1, pLut->Level <= nLevMax)) &&
     ((pLut->nFanouts <= nFanMax && (0 < pLut->nFanouts)))) {
    lVar2 = 0;
    do {
      if (pLut->pFanio[pLut->nFanins + lVar2] == (Nwk_Obj_t *)0x0) {
        return;
      }
      Nwk_ManMarkFanouts_rec(pLut->pFanio[pLut->nFanins + lVar2],nLevMax,nFanMax);
      lVar2 = lVar2 + 1;
    } while ((int)lVar2 < pLut->nFanouts);
  }
  return;
}

Assistant:

void Nwk_ManMarkFanouts_rec( Nwk_Obj_t * pLut, int nLevMax, int nFanMax )
{
    Nwk_Obj_t * pNext;
    int i;
    if ( !Nwk_ObjIsNode(pLut) )
        return;
    if ( Nwk_ObjIsTravIdCurrent( pLut ) )
        return;
    Nwk_ObjSetTravIdCurrent( pLut );
    if ( Nwk_ObjLevel(pLut) > nLevMax )
        return;
    if ( Nwk_ObjFanoutNum(pLut) > nFanMax )
        return;
    Nwk_ObjForEachFanout( pLut, pNext, i )
        Nwk_ManMarkFanouts_rec( pNext, nLevMax, nFanMax );
}